

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O0

void embree::CollideFunc(void *userPtr,RTCCollision *collisions,uint num_collisions)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uint in_EDX;
  long in_RSI;
  pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_> pVar4;
  uint in_stack_00000044;
  uint in_stack_00000048;
  uint in_stack_0000004c;
  uint in_stack_00000050;
  uint primID1;
  uint geomID1;
  uint primID0;
  uint geomID0;
  size_t i_1;
  Lock<embree::MutexSys> lock;
  bool intersect;
  size_t i;
  pair<unsigned_int,_unsigned_int> in_stack_ffffffffffffff58;
  pair<unsigned_int,_unsigned_int> in_stack_ffffffffffffff60;
  ulong local_40;
  ulong local_20;
  uint local_14;
  
  local_20 = 0;
  local_14 = in_EDX;
  while (local_20 < local_14) {
    bVar1 = intersect_triangle_triangle
                      (in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000044);
    if (bVar1) {
      local_20 = local_20 + 1;
    }
    else {
      local_14 = local_14 - 1;
      puVar3 = (undefined8 *)(in_RSI + (ulong)local_14 * 0x10);
      puVar2 = (undefined8 *)(in_RSI + local_20 * 0x10);
      *puVar2 = *puVar3;
      puVar2[1] = puVar3[1];
    }
  }
  if (local_14 != 0) {
    Lock<embree::MutexSys>::Lock
              ((Lock<embree::MutexSys> *)in_stack_ffffffffffffff60,
               (MutexSys *)in_stack_ffffffffffffff58);
    pVar4.second = in_stack_ffffffffffffff58;
    pVar4.first = in_stack_ffffffffffffff60;
    local_40 = 0;
    while( true ) {
      if (local_14 <= local_40) break;
      std::make_pair<unsigned_int_const&,unsigned_int_const&>((uint *)pVar4.second,(uint *)0x11d5b0)
      ;
      std::make_pair<unsigned_int_const&,unsigned_int_const&>((uint *)pVar4.second,(uint *)0x11d5d0)
      ;
      pVar4 = std::
              make_pair<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>>
                        ((pair<unsigned_int,_unsigned_int> *)pVar4.first,
                         (pair<unsigned_int,_unsigned_int> *)pVar4.second);
      std::
      vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::push_back((vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *)pVar4.first,(value_type *)pVar4.second);
      local_40 = local_40 + 1;
    }
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)pVar4.first);
  }
  return;
}

Assistant:

void CollideFunc (void* userPtr, RTCCollision* collisions, unsigned int num_collisions)
{
    for (size_t i=0; i<num_collisions;)
    {
      bool intersect = intersect_triangle_triangle(collisions[i].geomID0,collisions[i].primID0,
                                                   collisions[i].geomID1,collisions[i].primID1);
      if (intersect) i++;
      else collisions[i] = collisions[--num_collisions];
    }
  
  if (num_collisions == 0) 
    return;

  Lock<MutexSys> lock(mutex);
  for (size_t i=0; i<num_collisions; i++)
  {
    const unsigned geomID0 = collisions[i].geomID0;
    const unsigned primID0 = collisions[i].primID0;
    const unsigned geomID1 = collisions[i].geomID1;
    const unsigned primID1 = collisions[i].primID1;

    static_cast<Collisions*>(userPtr)->push_back(std::make_pair(std::make_pair(geomID0,primID0),std::make_pair(geomID1,primID1)));
  }
}